

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeIntegralityInterface
          (Highs *this,HighsIndexCollection *index_collection,HighsVarType *integrality)

{
  byte bVar1;
  allocator_type *in_RDX;
  HighsIndexCollection *in_RSI;
  Highs *in_RDI;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_integrality;
  HighsInt num_integrality;
  string *in_stack_ffffffffffffff50;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *this_00;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  HighsLogOptions *log_options;
  allocator *new_integrality;
  HighsLp *in_stack_ffffffffffffff80;
  allocator local_49;
  string local_48 [36];
  HighsInt local_24;
  allocator_type *local_20;
  HighsStatus local_4;
  
  local_20 = in_RDX;
  local_24 = dataSize(in_RSI);
  if (local_24 < 1) {
    local_4 = kOk;
  }
  else {
    log_options = &(in_RDI->options_).super_HighsOptionsStruct.log_options;
    new_integrality = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"column integrality",new_integrality);
    bVar1 = highsVarTypeUserDataNotNull
                      (log_options,
                       (HighsVarType *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)
                       ,in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if ((bVar1 & 1) == 0) {
      this_00 = (vector<HighsVarType,_std::allocator<HighsVarType>_> *)&stack0xffffffffffffff87;
      std::allocator<HighsVarType>::allocator((allocator<HighsVarType> *)0x4db1c5);
      std::vector<HighsVarType,std::allocator<HighsVarType>>::vector<HighsVarType_const*,void>
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_ffffffffffffff80,
                 (HighsVarType *)in_RDI,(HighsVarType *)new_integrality,local_20);
      std::allocator<HighsVarType>::~allocator((allocator<HighsVarType> *)0x4db1ea);
      changeLpIntegrality(in_stack_ffffffffffffff80,(HighsIndexCollection *)in_RDI,
                          (vector<HighsVarType,_std::allocator<HighsVarType>_> *)new_integrality);
      invalidateModelStatus(in_RDI);
      local_4 = kOk;
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector(this_00);
    }
    else {
      local_4 = kError;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::changeIntegralityInterface(
    HighsIndexCollection& index_collection, const HighsVarType* integrality) {
  HighsInt num_integrality = dataSize(index_collection);
  // If a non-positive number of integrality (may) need changing nothing needs
  // to be done
  if (num_integrality <= 0) return HighsStatus::kOk;
  if (highsVarTypeUserDataNotNull(options_.log_options, integrality,
                                  "column integrality"))
    return HighsStatus::kError;
  // Take a copy of the integrality that can be normalised
  std::vector<HighsVarType> local_integrality{integrality,
                                              integrality + num_integrality};
  // If changing the integrality for a set of columns, verify that the
  // set entries are in ascending order
  if (index_collection.is_set_)
    assert(increasingSetOk(index_collection.set_, 0,
                           index_collection.dimension_, true));
  changeLpIntegrality(model_.lp_, index_collection, local_integrality);
  // Deduce the consequences of new integrality
  invalidateModelStatus();
  return HighsStatus::kOk;
}